

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

uint64_t kratos::hash_generator(Generator *generator)

{
  bool bVar1;
  Context *this;
  void *key;
  uint64_t len;
  undefined1 local_a0 [8];
  HashVisitor hash_visitor;
  Generator *generator_local;
  
  hash_visitor.context_ = (Context *)generator;
  this = Generator::context(generator);
  bVar1 = Context::is_unique(this,(Generator *)hash_visitor.context_);
  if (bVar1) {
    key = (void *)std::__cxx11::string::c_str();
    len = std::__cxx11::string::size();
    generator_local = (Generator *)hash_64_fnv1a(key,len);
  }
  else {
    HashVisitor::HashVisitor((HashVisitor *)local_a0,(Generator *)hash_visitor.context_);
    IRVisitor::visit_root((IRVisitor *)local_a0,(IRNode *)hash_visitor.context_);
    generator_local = (Generator *)HashVisitor::produce_hash((HashVisitor *)local_a0);
    HashVisitor::~HashVisitor((HashVisitor *)local_a0);
  }
  return (uint64_t)generator_local;
}

Assistant:

uint64_t hash_generator(Generator* generator) {
    // if it's unique, just has the name
    if (generator->context()->is_unique(generator)) {
        return hash_64_fnv1a(generator->name.c_str(), generator->name.size());
    }
    // we use a visitor to compute all the hashes
    HashVisitor hash_visitor(generator);
    hash_visitor.visit_root(generator);
    return hash_visitor.produce_hash();
}